

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

Image * __thiscall Image::nearestNeighbourInterpolation(Image *__return_storage_ptr__,Image *this)

{
  int iVar1;
  int *piVar2;
  int local_24;
  int local_20;
  int j;
  int i;
  Image *this_local;
  Image *result;
  
  Image(__return_storage_ptr__,this->row << 1,this->col << 1,this->maxGray);
  for (local_20 = 0; SBORROW4(local_20,this->row * 2) != local_20 + this->row * -2 < 0;
      local_20 = local_20 + 1) {
    for (local_24 = 0; SBORROW4(local_24,this->col * 2) != local_24 + this->col * -2 < 0;
        local_24 = local_24 + 1) {
      iVar1 = this->matrix[local_20 / 2][local_24 / 2];
      piVar2 = operator[](__return_storage_ptr__,local_20);
      piVar2[local_24] = iVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::nearestNeighbourInterpolation()
{
    Image result = Image(2*row, 2*col, maxGray);

    for (int i = 0; i < 2*row; ++i) {
        for (int j = 0; j < 2*col; ++j) {
            result[i][j] = matrix[i/2][j/2];
        }
    }

    return result;
}